

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_hold(command *cmd)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  wchar_t index;
  command *cmd_local;
  
  player->upkeep->energy_use = (uint)z_info->move_energy;
  search(player);
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isshop((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      index = square_shopnum((chunk *)cave,grid_00);
      _Var1 = index_is_home(index);
      if (!_Var1) {
        msg("There is a scream and the door slams shut!");
        return;
      }
    }
    disturb(player);
    event_signal(EVENT_ENTER_STORE);
    event_remove_handler_type(EVENT_ENTER_STORE);
    event_signal(EVENT_USE_STORE);
    event_remove_handler_type(EVENT_USE_STORE);
    event_signal(EVENT_LEAVE_STORE);
    event_remove_handler_type(EVENT_LEAVE_STORE);
    player->upkeep->energy_use = L'\0';
  }
  else if (((player->opts).opt[5] & 1U) == 0) {
    event_signal(EVENT_SEEFLOOR);
    grid_01.x = (player->grid).x;
    grid_01.y = (player->grid).y;
    square_know_pile((chunk *)cave,grid_01,(_func__Bool_object_ptr *)0x0);
  }
  else {
    cmdq_push(CMD_PICKUP);
    if ((int)(uint)z_info->move_energy < player->upkeep->energy_use) {
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
  }
  return;
}

Assistant:

void do_cmd_hold(struct command *cmd)
{
	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Searching (probably not necessary - NRM)*/
	search(player);

	/* Enter a store if we are on one, otherwise look at the floor */
	if (square_isshop(cave, player->grid)) {
		if (player_is_shapechanged(player) &&
			!index_is_home(square_shopnum(cave, player->grid))) {
			msg("There is a scream and the door slams shut!");
			return;
		}
		disturb(player);
		event_signal(EVENT_ENTER_STORE);
		event_remove_handler_type(EVENT_ENTER_STORE);
		event_signal(EVENT_USE_STORE);
		event_remove_handler_type(EVENT_USE_STORE);
		event_signal(EVENT_LEAVE_STORE);
		event_remove_handler_type(EVENT_LEAVE_STORE);

		/* Turn will be taken exiting the shop */
		player->upkeep->energy_use = 0;
	} else {
		if (OPT(player, pickup_always)) {
			/* Pick things up, not using extra energy */
			cmdq_push(CMD_PICKUP);
			if (player->upkeep->energy_use > z_info->move_energy)
				player->upkeep->energy_use = z_info->move_energy;
		} else {
			event_signal(EVENT_SEEFLOOR);
			square_know_pile(cave, player->grid, NULL);
		}
	}
}